

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib566.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  FILE *moo;
  double content_length;
  CURL *curl;
  char *pcStack_18;
  CURLcode res;
  char *URL_local;
  
  moo = (FILE *)0x4008000000000000;
  pcStack_18 = URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    content_length = (double)curl_easy_init();
    if (content_length == 0.0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(content_length,0x2712,pcStack_18);
      if (((curl._4_4_ == 0) &&
          (curl._4_4_ = curl_easy_setopt(content_length,0x2a,1), curl._4_4_ == 0)) &&
         (curl._4_4_ = curl_easy_perform(content_length), curl._4_4_ == 0)) {
        curl._4_4_ = curl_easy_getinfo(content_length,0x30000f,&moo);
        __stream = fopen64(libtest_arg2,"wb");
        if (__stream != (FILE *)0x0) {
          curl_mfprintf(moo,__stream,"CL: %.0f\n");
          fclose(__stream);
        }
      }
      curl_easy_cleanup(content_length);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  double content_length = 3;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  res = curl_easy_perform(curl);

  if(!res) {
    FILE *moo;
    res = curl_easy_getinfo(curl, CURLINFO_CONTENT_LENGTH_DOWNLOAD,
                            &content_length);
    moo = fopen(libtest_arg2, "wb");
    if(moo) {
      fprintf(moo, "CL: %.0f\n", content_length);
      fclose(moo);
    }
  }

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}